

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Appearance_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::Appearance_PDU::SetEntityMarkingFlag(Appearance_PDU *this,KBOOL F)

{
  KUINT16 *pKVar1;
  short sVar2;
  
  if ((((this->m_AppearanceFlag1Union).m_ui8Flag & 8) == 0) == F) {
    sVar2 = -0xc;
    if (F) {
      sVar2 = 0xc;
    }
    (this->m_AppearanceFlag1Union).m_ui8Flag =
         (this->m_AppearanceFlag1Union).m_ui8Flag & 0xf7 | F * '\b';
    pKVar1 = &(this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + sVar2;
  }
  return;
}

Assistant:

void Appearance_PDU::SetEntityMarkingFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_AppearanceFlag1Union.m_ui8Mark )return;

    m_AppearanceFlag1Union.m_ui8Mark = F;

    if( F )
    {
        m_ui16PDULength += EntityMarking::ENTITY_MARKING_SIZE;
    }
    else
    {
        m_ui16PDULength -= EntityMarking::ENTITY_MARKING_SIZE;
    }
}